

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pytypes.h
# Opt level: O2

void __thiscall
pybind11::detail::accessor<pybind11::detail::accessor_policies::str_attr>::operator=
          (accessor<pybind11::detail::accessor_policies::str_attr> *this,char (*value) [207])

{
  handle obj;
  char *name;
  handle local_20;
  
  obj.m_ptr = (this->obj).m_ptr;
  name = this->key;
  object_or_cast<const_char_(&)[207],_0>((detail *)&local_20,value);
  setattr(obj,name,local_20);
  object::~object((object *)&local_20);
  return;
}

Assistant:

void operator=(T &&value) && {
        Policy::set(obj, key, object_or_cast(std::forward<T>(value)));
    }